

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spc_Emu.cpp
# Opt level: O0

void get_spc_info(header_t *h,byte_ *xid6,long xid6_size,track_info_t *out)

{
  uint uVar1;
  char *in_RCX;
  long in_RDX;
  long in_RDI;
  int offset;
  uint n;
  int i;
  long len_secs;
  track_info_t *in_stack_00000140;
  long in_stack_00000148;
  byte_ *in_stack_00000150;
  int in_size;
  char *in;
  
  in = (char *)0x0;
  in_size = 0;
  do {
    if (2 < in_size) {
LAB_009636a4:
      if ((in == (char *)0x0) || (0x1fff < (long)in)) {
        uVar1 = get_le16((void *)(in_RDI + 0xa9));
        in = (char *)(ulong)uVar1;
      }
      if ((long)in < 0x1fff) {
        *(long *)(in_RCX + 8) = (long)in * 1000;
      }
      Gme_File::copy_field_(in_RCX,in,in_size);
      Gme_File::copy_field_(in_RCX,in,in_size);
      Gme_File::copy_field_(in_RCX,in,in_size);
      Gme_File::copy_field_(in_RCX,in,in_size);
      Gme_File::copy_field_(in_RCX,in,in_size);
      if (in_RDX != 0) {
        get_spc_xid6(in_stack_00000150,in_stack_00000148,in_stack_00000140);
      }
      return;
    }
    uVar1 = *(byte *)(in_RDI + 0xa9 + (long)in_size) - 0x30;
    if (9 < uVar1) {
      if ((in_size == 1) &&
         ((*(char *)(in_RDI + 0xb0) != '\0' || (*(char *)(in_RDI + 0xb1) == '\0')))) {
        in = (char *)0x0;
      }
      goto LAB_009636a4;
    }
    in = (char *)((ulong)uVar1 + (long)in * 10);
    in_size = in_size + 1;
  } while( true );
}

Assistant:

static void get_spc_info( Spc_Emu::header_t const& h, byte const* xid6, long xid6_size,
		track_info_t* out )
{
	// decode length (can be in text or binary format, sometimes ambiguous ugh)
	long len_secs = 0;
	for ( int i = 0; i < 3; i++ )
	{
		unsigned n = h.len_secs [i] - '0';
		if ( n > 9 )
		{
			// ignore single-digit text lengths
			// (except if author field is present and begins at offset 1, ugh)
			if ( i == 1 && (h.author [0] || !h.author [1]) )
				len_secs = 0;
			break;
		}
		len_secs *= 10;
		len_secs += n;
	}
	if ( !len_secs || len_secs > 0x1FFF )
		len_secs = get_le16( h.len_secs );
	if ( len_secs < 0x1FFF )
		out->length = len_secs * 1000;
	
	int offset = (h.author [0] < ' ' || unsigned (h.author [0] - '0') <= 9);
	Gme_File::copy_field_( out->author, &h.author [offset], sizeof h.author - offset );
	
	GME_COPY_FIELD( h, out, song );
	GME_COPY_FIELD( h, out, game );
	GME_COPY_FIELD( h, out, dumper );
	GME_COPY_FIELD( h, out, comment );
	
	if ( xid6_size )
		get_spc_xid6( xid6, xid6_size, out );
}